

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O3

void __thiscall EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this->loop_ = (EventLoop *)0x0;
  this->exiting_ = false;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x18);
  *(code **)local_38._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = 0;
  *(EventLoopThread **)((long)local_38._M_unused._0_8_ + 0x10) = this;
  local_20 = std::
             _Function_handler<void_(),_std::_Bind<void_(EventLoopThread::*(EventLoopThread_*))()>_>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_std::_Bind<void_(EventLoopThread::*(EventLoopThread_*))()>_>
             ::_M_manager;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"EventLoopThread","");
  Thread::Thread(&this->thread_,(ThreadFunc *)&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  pthread_mutex_init((pthread_mutex_t *)&this->mutex_,(pthread_mutexattr_t *)0x0);
  (this->cond_).mutex = &this->mutex_;
  pthread_cond_init((pthread_cond_t *)&(this->cond_).cond,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
    : loop_(NULL),
      exiting_(false),
      thread_(std::bind(&EventLoopThread::threadFunc, this), "EventLoopThread"),
      mutex_(),
      cond_(mutex_) {
}